

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::BitsToFloatCase::compare
          (BitsToFloatCase *this,void **inputs,void **outputs)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ostream *poVar4;
  ostringstream *this_00;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  Hex<8UL> local_30;
  
  uVar3 = glu::getDataTypeScalarSize
                    ((((this->super_CommonFunctionCase).m_spec.inputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  bVar7 = true;
  if (0 < (int)uVar3) {
    uVar5 = **inputs;
    uVar1 = **outputs;
    uVar2 = uVar1 - uVar5;
    if (uVar1 < uVar5) {
      uVar2 = -(uVar1 - uVar5);
    }
    uVar6 = 0;
    bVar7 = false;
    if (uVar2 == 0) {
      uVar6 = 0;
      do {
        if ((ulong)uVar3 - 1 == uVar6) {
          return true;
        }
        uVar5 = *(uint *)((long)*inputs + (uVar6 + 1) * 4);
        uVar1 = *(uint *)((long)*outputs + (uVar6 + 1) * 4);
        uVar2 = uVar1 - uVar5;
        if (uVar1 < uVar5) {
          uVar2 = -(uVar1 - uVar5);
        }
        uVar6 = uVar6 + 1;
      } while (uVar2 == 0);
      bVar7 = uVar3 <= uVar6;
    }
    this_00 = &(this->super_CommonFunctionCase).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
    poVar4 = (ostream *)std::ostream::operator<<(this_00,(int)uVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
    local_30.value = (deUint64)uVar5;
    poVar4 = tcu::Format::Hex<8UL>::toStream(&local_30,poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," with ULP threshold ",0x14);
    local_30.value = 0;
    poVar4 = tcu::Format::Hex<8UL>::toStream(&local_30,poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", got ULP diff ",0xf);
    local_30.value = (ulong)uVar2;
    tcu::Format::Hex<8UL>::toStream(&local_30,poVar4);
  }
  return bVar7;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const deUint32			maxUlpDiff		= 0;

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const deUint32	ulpDiff		= getUlpDiff(in0, out0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(tcu::Float32(in0).bits()) << " with ULP threshold "
							<< tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}